

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O0

void __thiscall
slang::ast::RecursiveStructMemberIterator::RecursiveStructMemberIterator
          (RecursiveStructMemberIterator *this,ConstantValue *startVal,Type *startType)

{
  undefined1 uVar1;
  Type *this_00;
  UnpackedStructType *pUVar2;
  iterator iVar3;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL> fields;
  Type *in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffffb0;
  span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL> local_38 [2];
  undefined8 local_18;
  undefined8 local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  State::State((State *)in_stack_ffffffffffffff90);
  SmallVector<slang::ast::RecursiveStructMemberIterator::State,_4UL>::SmallVector
            ((SmallVector<slang::ast::RecursiveStructMemberIterator::State,_4UL> *)0x9d3755);
  *in_RDI = local_10;
  in_RDI[1] = local_18;
  uVar1 = Type::isUnpackedStruct((Type *)0x9d3774);
  if ((bool)uVar1) {
    this_00 = Type::getCanonicalType(in_stack_ffffffffffffff90);
    pUVar2 = Symbol::as<slang::ast::UnpackedStructType>((Symbol *)0x9d37a6);
    local_38[0]._M_ptr = (pUVar2->fields)._M_ptr;
    local_38[0]._M_extent._M_extent_value = (pUVar2->fields)._M_extent._M_extent_value;
    iVar3 = std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>::begin(local_38)
    ;
    in_RDI[3] = iVar3._M_current;
    iVar3 = std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>::end
                      ((span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL> *)this_00
                      );
    in_RDI[4] = iVar3._M_current;
    prepNext((RecursiveStructMemberIterator *)CONCAT17(uVar1,in_stack_ffffffffffffffb0));
  }
  return;
}

Assistant:

RecursiveStructMemberIterator(const ConstantValue& startVal, const Type& startType) {
        curr.val = &startVal;
        curr.type = &startType;

        if (curr.type->isUnpackedStruct()) {
            auto fields = curr.type->getCanonicalType().as<UnpackedStructType>().fields;
            curr.fieldIt = fields.begin();
            curr.fieldEnd = fields.end();
            prepNext();
        }
    }